

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O3

void Hpipe::anon_unknown_5::output_rec(ostream *ss,Node *node)

{
  double dVar1;
  double dVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  Node *pNVar7;
  
  pNVar7 = (node->ok).data;
  if (pNVar7 == (Node *)0x0) {
    pcVar6 = node->name;
    if (pcVar6 != (char *)0x0) {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(ss,"/*",2);
    ss = std::ostream::_M_insert<double>(node->freq);
    pcVar6 = "*/";
    goto LAB_001336f5;
  }
  dVar1 = pNVar7->freq;
  dVar2 = ((node->ko).data)->freq;
  if (node->use_equ == true) {
    if (dVar1 < dVar2) {
      pcVar6 = "if ( *data != ";
      goto LAB_00133627;
    }
    pcVar6 = "if ( *data == ";
    lVar5 = 0xe;
LAB_00133693:
    std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,lVar5);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)ss,node->beg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ) { ",5);
    output_rec(ss,(node->ok).data);
    std::__ostream_insert<char,std::char_traits<char>>(ss," } else { ",10);
    pNVar7 = (node->ko).data;
  }
  else {
    if (dVar2 <= dVar1) {
      pcVar6 = "if ( *data < ";
      lVar5 = 0xd;
      goto LAB_00133693;
    }
    pcVar6 = "if ( *data >= ";
LAB_00133627:
    std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)ss,node->beg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ) { ",5);
    output_rec(ss,(node->ko).data);
    std::__ostream_insert<char,std::char_traits<char>>(ss," } else { ",10);
    pNVar7 = (node->ok).data;
  }
  output_rec(ss,pNVar7);
  pcVar6 = " }";
LAB_001336f5:
  std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,2);
  return;
}

Assistant:

static void output_rec( std::ostream &ss, const BranchSet::Node *node ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            if ( use_neg ) {
                ss << "if ( *data != " << node->beg << " ) { ";
                output_rec( ss, node->ko.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ok.ptr() );
                ss << " }";
            } else {
                ss << "if ( *data == " << node->beg << " ) { ";
                output_rec( ss, node->ok.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ko.ptr() );
                ss << " }";
            }
        } else {
            if ( use_neg ) {
                ss << "if ( *data >= " << node->beg << " ) { ";
                output_rec( ss, node->ko.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ok.ptr() );
                ss << " }";
            } else {
                ss << "if ( *data < " << node->beg << " ) { ";
                output_rec( ss, node->ok.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ko.ptr() );
                ss << " }";
            }
        }
    } else {
        if ( node->name )
            ss << node->name;
        ss << "/*" << node->freq << "*/";
    }
}